

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

int32_t __thiscall wasm::Random::get32(Random *this)

{
  ushort uVar1;
  int16_t iVar2;
  
  uVar1 = get16(this);
  iVar2 = get16(this);
  return (int)iVar2 | (uint)uVar1 << 0x10;
}

Assistant:

int32_t Random::get32() {
  auto temp = uint32_t(get16()) << 16;
  return temp | uint32_t(get16());
}